

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGridHeader.cpp
# Opt level: O0

void __thiscall PatternGridHeader::soloTrack(PatternGridHeader *this,int track)

{
  bool bVar1;
  QFlags<ChannelOutput::Flag> local_24;
  QFlags<ChannelOutput::Flag> local_20;
  Int local_1c;
  Flag local_18;
  int local_14;
  Flag soloFlag;
  int track_local;
  PatternGridHeader *this_local;
  
  local_18 = 1 << ((byte)track & 0x1f);
  local_1c = (this->mTrackFlags).i;
  local_14 = track;
  _soloFlag = this;
  bVar1 = ::operator==(local_18,(QFlags<ChannelOutput::Flag>)local_1c);
  if (bVar1) {
    QFlags<ChannelOutput::Flag>::QFlags(&local_20,AllOn);
    (this->mTrackFlags).i = local_20.i;
  }
  else {
    QFlags<ChannelOutput::Flag>::QFlags(&local_24,local_18);
    (this->mTrackFlags).i = local_24.i;
  }
  outputChanged(this,(Flags)(this->mTrackFlags).i);
  QWidget::update();
  return;
}

Assistant:

void PatternGridHeader::soloTrack(int track) {
    auto soloFlag = (ChannelOutput::Flag)(1 << track);
    if (soloFlag == mTrackFlags) {
        // unsolo
        mTrackFlags = ChannelOutput::AllOn;
    } else {
        // solo
        mTrackFlags = soloFlag;
    }
    emit outputChanged(mTrackFlags);
    update();
}